

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

ManagedType __thiscall cmGeneratorTarget::GetManagedType(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  ManagedType MVar3;
  int iVar4;
  ImportInfo *pIVar5;
  cmValue cVar6;
  size_type __dnew;
  string local_48;
  size_type local_28;
  
  TVar2 = cmTarget::GetType(this->Target);
  MVar3 = Undefined;
  if ((int)TVar2 < 3) {
    TVar2 = cmTarget::GetType(this->Target);
    MVar3 = Native;
    if (TVar2 != STATIC_LIBRARY) {
      bVar1 = cmTarget::IsImported(this->Target);
      if (bVar1) {
        pIVar5 = GetImportInfo(this,config);
        MVar3 = Undefined;
        if (pIVar5 != (ImportInfo *)0x0) {
          MVar3 = pIVar5->Managed;
        }
      }
      else {
        local_28 = 0x17;
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        local_48._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_28);
        local_48.field_2._M_allocated_capacity = local_28;
        builtin_strncpy(local_48._M_dataplus._M_p,"COMMON_LANGUAGE_RUNTIME",0x17);
        local_48._M_string_length = local_28;
        local_48._M_dataplus._M_p[local_28] = '\0';
        cVar6 = GetProperty(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        if (cVar6.Value == (string *)0x0) {
          bVar1 = IsCSharpOnly(this);
          MVar3 = (uint)bVar1 * 2 + Native;
        }
        else if ((cVar6.Value)->_M_string_length == 0) {
          MVar3 = Mixed;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)cVar6.Value);
          MVar3 = Managed - (iVar4 == 0);
        }
      }
    }
  }
  return MVar3;
}

Assistant:

cmGeneratorTarget::ManagedType cmGeneratorTarget::GetManagedType(
  const std::string& config) const
{
  // Only libraries and executables can be managed targets.
  if (this->GetType() > cmStateEnums::SHARED_LIBRARY) {
    return ManagedType::Undefined;
  }

  if (this->GetType() == cmStateEnums::STATIC_LIBRARY) {
    return ManagedType::Native;
  }

  // Check imported target.
  if (this->IsImported()) {
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      return info->Managed;
    }
    return ManagedType::Undefined;
  }

  // Check for explicitly set clr target property.
  if (cmValue clr = this->GetProperty("COMMON_LANGUAGE_RUNTIME")) {
    return this->CheckManagedType(*clr);
  }

  // C# targets are always managed. This language specific check
  // is added to avoid that the COMMON_LANGUAGE_RUNTIME target property
  // has to be set manually for C# targets.
  return this->IsCSharpOnly() ? ManagedType::Managed : ManagedType::Native;
}